

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_ssse3.c
# Opt level: O1

void av1_build_compound_diffwtd_mask_highbd_ssse3
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w,int bd)

{
  short *psVar1;
  short *psVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int j;
  ulong uVar6;
  ushort uVar7;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar16;
  short sVar17;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 auVar18 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  if (7 < w) {
    lVar3 = (long)src0 * 2;
    lVar4 = (long)src1 * 2;
    if (bd == 8) {
      if (mask_type == '\x01') {
        if (0 < h) {
          iVar5 = 0;
          do {
            uVar6 = 0;
            do {
              psVar1 = (short *)(lVar3 + uVar6 * 2);
              psVar2 = (short *)(lVar4 + uVar6 * 2);
              auVar8._0_2_ = *psVar1 - *psVar2;
              auVar8._2_2_ = psVar1[1] - psVar2[1];
              auVar8._4_2_ = psVar1[2] - psVar2[2];
              auVar8._6_2_ = psVar1[3] - psVar2[3];
              auVar8._8_2_ = psVar1[4] - psVar2[4];
              auVar8._10_2_ = psVar1[5] - psVar2[5];
              auVar8._12_2_ = psVar1[6] - psVar2[6];
              auVar8._14_2_ = psVar1[7] - psVar2[7];
              auVar9 = pabsw(auVar8,auVar8);
              auVar9 = psraw(auVar9,4);
              sVar17 = auVar9._0_2_;
              uVar7 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
              sVar17 = auVar9._2_2_;
              uVar10 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
              sVar17 = auVar9._4_2_;
              uVar11 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
              sVar17 = auVar9._6_2_;
              uVar12 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
              sVar17 = auVar9._8_2_;
              uVar13 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
              sVar17 = auVar9._10_2_;
              uVar14 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
              sVar17 = auVar9._12_2_;
              sVar19 = auVar9._14_2_;
              uVar15 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
              uVar16 = (ushort)(sVar19 < -0x26) * -0x26 | (ushort)(sVar19 >= -0x26) * sVar19;
              sVar17 = 0x1a - ((ushort)(0x1a < (short)uVar7) * 0x1a | (0x1a >= (short)uVar7) * uVar7
                              );
              sVar19 = 0x1a - ((ushort)(0x1a < (short)uVar10) * 0x1a |
                              (0x1a >= (short)uVar10) * uVar10);
              sVar20 = 0x1a - ((ushort)(0x1a < (short)uVar11) * 0x1a |
                              (0x1a >= (short)uVar11) * uVar11);
              sVar21 = 0x1a - ((ushort)(0x1a < (short)uVar12) * 0x1a |
                              (0x1a >= (short)uVar12) * uVar12);
              sVar22 = 0x1a - ((ushort)(0x1a < (short)uVar13) * 0x1a |
                              (0x1a >= (short)uVar13) * uVar13);
              sVar23 = 0x1a - ((ushort)(0x1a < (short)uVar14) * 0x1a |
                              (0x1a >= (short)uVar14) * uVar14);
              sVar24 = 0x1a - ((ushort)(0x1a < (short)uVar15) * 0x1a |
                              (0x1a >= (short)uVar15) * uVar15);
              sVar25 = 0x1a - ((ushort)(0x1a < (short)uVar16) * 0x1a |
                              (0x1a >= (short)uVar16) * uVar16);
              *(ulong *)(mask + uVar6) =
                   CONCAT17((0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25),
                            CONCAT16((0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 -
                                     (0xff < sVar24),
                                     CONCAT15((0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 -
                                              (0xff < sVar23),
                                              CONCAT14((0 < sVar22) * (sVar22 < 0x100) *
                                                       (char)sVar22 - (0xff < sVar22),
                                                       CONCAT13((0 < sVar21) * (sVar21 < 0x100) *
                                                                (char)sVar21 - (0xff < sVar21),
                                                                CONCAT12((0 < sVar20) *
                                                                         (sVar20 < 0x100) *
                                                                         (char)sVar20 -
                                                                         (0xff < sVar20),
                                                                         CONCAT11((0 < sVar19) *
                                                                                  (sVar19 < 0x100) *
                                                                                  (char)sVar19 -
                                                                                  (0xff < sVar19),
                                                                                  (0 < sVar17) *
                                                                                  (sVar17 < 0x100) *
                                                                                  (char)sVar17 -
                                                                                  (0xff < sVar17))))
                                                      ))));
              uVar6 = uVar6 + 8;
            } while (uVar6 < (uint)w);
            mask = mask + (uint)w;
            iVar5 = iVar5 + 1;
            lVar4 = lVar4 + (long)src1_stride * 2;
            lVar3 = lVar3 + (long)src0_stride * 2;
          } while (iVar5 != h);
        }
      }
      else if (0 < h) {
        iVar5 = 0;
        do {
          uVar6 = 0;
          do {
            psVar1 = (short *)(lVar3 + uVar6 * 2);
            psVar2 = (short *)(lVar4 + uVar6 * 2);
            auVar18._0_2_ = *psVar1 - *psVar2;
            auVar18._2_2_ = psVar1[1] - psVar2[1];
            auVar18._4_2_ = psVar1[2] - psVar2[2];
            auVar18._6_2_ = psVar1[3] - psVar2[3];
            auVar18._8_2_ = psVar1[4] - psVar2[4];
            auVar18._10_2_ = psVar1[5] - psVar2[5];
            auVar18._12_2_ = psVar1[6] - psVar2[6];
            auVar18._14_2_ = psVar1[7] - psVar2[7];
            auVar9 = pabsw(auVar18,auVar18);
            auVar9 = psraw(auVar9,4);
            sVar17 = auVar9._0_2_;
            uVar7 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
            sVar17 = auVar9._2_2_;
            uVar10 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
            sVar17 = auVar9._4_2_;
            uVar11 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
            sVar17 = auVar9._6_2_;
            uVar12 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
            sVar17 = auVar9._8_2_;
            uVar13 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
            sVar17 = auVar9._10_2_;
            uVar14 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
            sVar17 = auVar9._12_2_;
            sVar19 = auVar9._14_2_;
            uVar15 = (ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17;
            uVar16 = (ushort)(sVar19 < -0x26) * -0x26 | (ushort)(sVar19 >= -0x26) * sVar19;
            sVar17 = ((ushort)(0x1a < (short)uVar7) * 0x1a | (0x1a >= (short)uVar7) * uVar7) + 0x26;
            sVar19 = ((ushort)(0x1a < (short)uVar10) * 0x1a | (0x1a >= (short)uVar10) * uVar10) +
                     0x26;
            sVar20 = ((ushort)(0x1a < (short)uVar11) * 0x1a | (0x1a >= (short)uVar11) * uVar11) +
                     0x26;
            sVar21 = ((ushort)(0x1a < (short)uVar12) * 0x1a | (0x1a >= (short)uVar12) * uVar12) +
                     0x26;
            sVar22 = ((ushort)(0x1a < (short)uVar13) * 0x1a | (0x1a >= (short)uVar13) * uVar13) +
                     0x26;
            sVar23 = ((ushort)(0x1a < (short)uVar14) * 0x1a | (0x1a >= (short)uVar14) * uVar14) +
                     0x26;
            sVar24 = ((ushort)(0x1a < (short)uVar15) * 0x1a | (0x1a >= (short)uVar15) * uVar15) +
                     0x26;
            sVar25 = ((ushort)(0x1a < (short)uVar16) * 0x1a | (0x1a >= (short)uVar16) * uVar16) +
                     0x26;
            *(ulong *)(mask + uVar6) =
                 CONCAT17((0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25),
                          CONCAT16((0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24),
                                   CONCAT15((0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 -
                                            (0xff < sVar23),
                                            CONCAT14((0 < sVar22) * (sVar22 < 0x100) * (char)sVar22
                                                     - (0xff < sVar22),
                                                     CONCAT13((0 < sVar21) * (sVar21 < 0x100) *
                                                              (char)sVar21 - (0xff < sVar21),
                                                              CONCAT12((0 < sVar20) *
                                                                       (sVar20 < 0x100) *
                                                                       (char)sVar20 -
                                                                       (0xff < sVar20),
                                                                       CONCAT11((0 < sVar19) *
                                                                                (sVar19 < 0x100) *
                                                                                (char)sVar19 -
                                                                                (0xff < sVar19),
                                                                                (0 < sVar17) *
                                                                                (sVar17 < 0x100) *
                                                                                (char)sVar17 -
                                                                                (0xff < sVar17))))))
                                  ));
            uVar6 = uVar6 + 8;
          } while (uVar6 < (uint)w);
          mask = mask + (uint)w;
          iVar5 = iVar5 + 1;
          lVar4 = lVar4 + (long)src1_stride * 2;
          lVar3 = lVar3 + (long)src0_stride * 2;
        } while (iVar5 != h);
      }
    }
    else {
      iVar5 = bd + -4;
      auVar9._0_8_ = (long)iVar5;
      auVar9._8_4_ = iVar5;
      auVar9._12_4_ = iVar5 >> 0x1f;
      if (mask_type == '\x01') {
        if (0 < h) {
          iVar5 = 0;
          do {
            uVar6 = 0;
            do {
              psVar1 = (short *)(lVar3 + uVar6 * 2);
              psVar2 = (short *)(lVar4 + uVar6 * 2);
              auVar26._0_2_ = *psVar1 - *psVar2;
              auVar26._2_2_ = psVar1[1] - psVar2[1];
              auVar26._4_2_ = psVar1[2] - psVar2[2];
              auVar26._6_2_ = psVar1[3] - psVar2[3];
              auVar26._8_2_ = psVar1[4] - psVar2[4];
              auVar26._10_2_ = psVar1[5] - psVar2[5];
              auVar26._12_2_ = psVar1[6] - psVar2[6];
              auVar26._14_2_ = psVar1[7] - psVar2[7];
              auVar27 = pabsw(auVar26,auVar26);
              auVar27 = psraw(auVar27,auVar9);
              sVar19 = auVar27._0_2_ + 0x26;
              sVar17 = auVar27._2_2_ + 0x26;
              sVar25 = auVar27._4_2_ + 0x26;
              sVar24 = auVar27._6_2_ + 0x26;
              sVar23 = auVar27._8_2_ + 0x26;
              sVar22 = auVar27._10_2_ + 0x26;
              sVar21 = auVar27._12_2_ + 0x26;
              sVar20 = auVar27._14_2_ + 0x26;
              sVar19 = (ushort)(-1 < sVar19) * sVar19;
              sVar17 = (ushort)(-1 < sVar17) * sVar17;
              sVar25 = (ushort)(-1 < sVar25) * sVar25;
              sVar24 = (ushort)(-1 < sVar24) * sVar24;
              sVar23 = (ushort)(-1 < sVar23) * sVar23;
              sVar22 = (ushort)(-1 < sVar22) * sVar22;
              sVar21 = (ushort)(-1 < sVar21) * sVar21;
              sVar20 = (ushort)(-1 < sVar20) * sVar20;
              sVar19 = 0x40 - ((ushort)(0x40 < sVar19) * 0x40 | (ushort)(0x40 >= sVar19) * sVar19);
              sVar17 = 0x40 - ((ushort)(0x40 < sVar17) * 0x40 | (ushort)(0x40 >= sVar17) * sVar17);
              sVar25 = 0x40 - ((ushort)(0x40 < sVar25) * 0x40 | (ushort)(0x40 >= sVar25) * sVar25);
              sVar24 = 0x40 - ((ushort)(0x40 < sVar24) * 0x40 | (ushort)(0x40 >= sVar24) * sVar24);
              sVar23 = 0x40 - ((ushort)(0x40 < sVar23) * 0x40 | (ushort)(0x40 >= sVar23) * sVar23);
              sVar22 = 0x40 - ((ushort)(0x40 < sVar22) * 0x40 | (ushort)(0x40 >= sVar22) * sVar22);
              sVar21 = 0x40 - ((ushort)(0x40 < sVar21) * 0x40 | (ushort)(0x40 >= sVar21) * sVar21);
              sVar20 = 0x40 - ((ushort)(0x40 < sVar20) * 0x40 | (ushort)(0x40 >= sVar20) * sVar20);
              *(ulong *)(mask + uVar6) =
                   CONCAT17((0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20),
                            CONCAT16((0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 -
                                     (0xff < sVar21),
                                     CONCAT15((0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 -
                                              (0xff < sVar22),
                                              CONCAT14((0 < sVar23) * (sVar23 < 0x100) *
                                                       (char)sVar23 - (0xff < sVar23),
                                                       CONCAT13((0 < sVar24) * (sVar24 < 0x100) *
                                                                (char)sVar24 - (0xff < sVar24),
                                                                CONCAT12((0 < sVar25) *
                                                                         (sVar25 < 0x100) *
                                                                         (char)sVar25 -
                                                                         (0xff < sVar25),
                                                                         CONCAT11((0 < sVar17) *
                                                                                  (sVar17 < 0x100) *
                                                                                  (char)sVar17 -
                                                                                  (0xff < sVar17),
                                                                                  (0 < sVar19) *
                                                                                  (sVar19 < 0x100) *
                                                                                  (char)sVar19 -
                                                                                  (0xff < sVar19))))
                                                      ))));
              uVar6 = uVar6 + 8;
            } while (uVar6 < (uint)w);
            mask = mask + (uint)w;
            iVar5 = iVar5 + 1;
            lVar4 = lVar4 + (long)src1_stride * 2;
            lVar3 = lVar3 + (long)src0_stride * 2;
          } while (iVar5 != h);
        }
      }
      else if (0 < h) {
        iVar5 = 0;
        do {
          uVar6 = 0;
          do {
            psVar1 = (short *)(lVar3 + uVar6 * 2);
            psVar2 = (short *)(lVar4 + uVar6 * 2);
            auVar27._0_2_ = *psVar1 - *psVar2;
            auVar27._2_2_ = psVar1[1] - psVar2[1];
            auVar27._4_2_ = psVar1[2] - psVar2[2];
            auVar27._6_2_ = psVar1[3] - psVar2[3];
            auVar27._8_2_ = psVar1[4] - psVar2[4];
            auVar27._10_2_ = psVar1[5] - psVar2[5];
            auVar27._12_2_ = psVar1[6] - psVar2[6];
            auVar27._14_2_ = psVar1[7] - psVar2[7];
            auVar27 = pabsw(auVar27,auVar27);
            auVar27 = psraw(auVar27,auVar9);
            sVar24 = auVar27._0_2_ + 0x26;
            sVar25 = auVar27._2_2_ + 0x26;
            sVar23 = auVar27._4_2_ + 0x26;
            sVar22 = auVar27._6_2_ + 0x26;
            sVar21 = auVar27._8_2_ + 0x26;
            sVar20 = auVar27._10_2_ + 0x26;
            sVar19 = auVar27._12_2_ + 0x26;
            sVar17 = auVar27._14_2_ + 0x26;
            sVar24 = (ushort)(-1 < sVar24) * sVar24;
            sVar25 = (ushort)(-1 < sVar25) * sVar25;
            sVar23 = (ushort)(-1 < sVar23) * sVar23;
            sVar22 = (ushort)(-1 < sVar22) * sVar22;
            sVar21 = (ushort)(-1 < sVar21) * sVar21;
            sVar20 = (ushort)(-1 < sVar20) * sVar20;
            sVar19 = (ushort)(-1 < sVar19) * sVar19;
            sVar17 = (ushort)(-1 < sVar17) * sVar17;
            uVar7 = (ushort)(0x40 < sVar24) * 0x40 | (ushort)(0x40 >= sVar24) * sVar24;
            uVar10 = (ushort)(0x40 < sVar25) * 0x40 | (ushort)(0x40 >= sVar25) * sVar25;
            uVar11 = (ushort)(0x40 < sVar23) * 0x40 | (ushort)(0x40 >= sVar23) * sVar23;
            uVar12 = (ushort)(0x40 < sVar22) * 0x40 | (ushort)(0x40 >= sVar22) * sVar22;
            uVar13 = (ushort)(0x40 < sVar21) * 0x40 | (ushort)(0x40 >= sVar21) * sVar21;
            uVar14 = (ushort)(0x40 < sVar20) * 0x40 | (ushort)(0x40 >= sVar20) * sVar20;
            uVar15 = (ushort)(0x40 < sVar19) * 0x40 | (ushort)(0x40 >= sVar19) * sVar19;
            uVar16 = (ushort)(0x40 < sVar17) * 0x40 | (ushort)(0x40 >= sVar17) * sVar17;
            *(ulong *)(mask + uVar6) =
                 CONCAT17((0 < (short)uVar16) * ((short)uVar16 < 0x100) * (char)uVar16 -
                          (0xff < (short)uVar16),
                          CONCAT16((0 < (short)uVar15) * ((short)uVar15 < 0x100) * (char)uVar15 -
                                   (0xff < (short)uVar15),
                                   CONCAT15((0 < (short)uVar14) * ((short)uVar14 < 0x100) *
                                            (char)uVar14 - (0xff < (short)uVar14),
                                            CONCAT14((0 < (short)uVar13) * ((short)uVar13 < 0x100) *
                                                     (char)uVar13 - (0xff < (short)uVar13),
                                                     CONCAT13((0 < (short)uVar12) *
                                                              ((short)uVar12 < 0x100) * (char)uVar12
                                                              - (0xff < (short)uVar12),
                                                              CONCAT12((0 < (short)uVar11) *
                                                                       ((short)uVar11 < 0x100) *
                                                                       (char)uVar11 -
                                                                       (0xff < (short)uVar11),
                                                                       CONCAT11((0 < (short)uVar10)
                                                                                * ((short)uVar10 <
                                                                                  0x100) *
                                                                                (char)uVar10 -
                                                                                (0xff < (short)
                                                  uVar10),(0 < (short)uVar7) *
                                                          ((short)uVar7 < 0x100) * (char)uVar7 -
                                                          (0xff < (short)uVar7))))))));
            uVar6 = uVar6 + 8;
          } while (uVar6 < (uint)w);
          mask = mask + (uint)w;
          iVar5 = iVar5 + 1;
          lVar4 = lVar4 + (long)src1_stride * 2;
          lVar3 = lVar3 + (long)src0_stride * 2;
        } while (iVar5 != h);
      }
    }
    return;
  }
  av1_build_compound_diffwtd_mask_highbd_c(mask,mask_type,src0,src0_stride,src1,src1_stride,h,w,bd);
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_highbd_ssse3(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const uint8_t *src0,
    int src0_stride, const uint8_t *src1, int src1_stride, int h, int w,
    int bd) {
  if (w < 8) {
    av1_build_compound_diffwtd_mask_highbd_c(mask, mask_type, src0, src0_stride,
                                             src1, src1_stride, h, w, bd);
  } else {
    assert(bd >= 8);
    assert((w % 8) == 0);
    assert(mask_type == DIFFWTD_38 || mask_type == DIFFWTD_38_INV);
    const __m128i x0 = _mm_setzero_si128();
    const __m128i xAOM_BLEND_A64_MAX_ALPHA =
        _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
    const int mask_base = 38;
    const __m128i xmask_base = _mm_set1_epi16(mask_base);
    const uint16_t *ssrc0 = CONVERT_TO_SHORTPTR(src0);
    const uint16_t *ssrc1 = CONVERT_TO_SHORTPTR(src1);
    if (bd == 8) {
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff = _mm_srai_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)),
                                          DIFF_FACTOR_LOG2);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_sub_epi16(xAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff = _mm_srai_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)),
                                          DIFF_FACTOR_LOG2);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    } else {
      const __m128i xshift = _mm_set1_epi64x(bd - 8 + DIFF_FACTOR_LOG2);
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff =
                _mm_sra_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)), xshift);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_sub_epi16(xAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff =
                _mm_sra_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)), xshift);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    }
  }
}